

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O2

void __thiscall
SuiteSessionTests::initiatorFixtureSendingTimeOutsideOfMaxLatency_RejectedHelper::
~initiatorFixtureSendingTimeOutsideOfMaxLatency_RejectedHelper
          (initiatorFixtureSendingTimeOutsideOfMaxLatency_RejectedHelper *this)

{
  sessionFixture::~sessionFixture((sessionFixture *)this);
  operator_delete(this,0x630);
  return;
}

Assistant:

TEST_FIXTURE(initiatorFixture, SendingTimeOutsideOfMaxLatency_Rejected)
{
  startLoggedOn();

  object->setMaxLatency(1);
  object->setCheckLatency(true);

  FIX42::NewOrderSingle newOrderSingle = createNewOrderSingle( "ISLD", "TW", 2 );
  UtcTimeStamp highLatency(16, 16, 16, 13, 5, 2150);
  newOrderSingle.getHeader().setField(SendingTime(highLatency));
  object->next( newOrderSingle, UtcTimeStamp() );

  CHECK_EQUAL(1, toReject);
}